

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O2

int __thiscall FName::NameManager::AddName(NameManager *this,char *text,uint hash,uint bucket)

{
  int iVar1;
  size_t sVar2;
  NameBlock *pNVar3;
  NameEntry *pNVar4;
  int iVar5;
  size_t len;
  size_t sVar6;
  char *__dest;
  
  pNVar3 = this->Blocks;
  sVar2 = strlen(text);
  len = sVar2 + 1;
  if ((pNVar3 == (NameBlock *)0x0) || (sVar6 = pNVar3->NextAlloc, 0xfff < sVar6 + len)) {
    pNVar3 = AddBlock(this,len);
    sVar6 = pNVar3->NextAlloc;
  }
  __dest = (char *)((long)&pNVar3->NextAlloc + sVar6);
  strcpy(__dest,text);
  pNVar3->NextAlloc = pNVar3->NextAlloc + len;
  iVar5 = this->NumNames;
  iVar1 = this->MaxNames;
  if (iVar5 < iVar1) {
    pNVar4 = this->NameArray;
  }
  else {
    iVar5 = iVar1 + 0x34b;
    if (iVar1 != 0) {
      iVar5 = iVar1 + 0x100;
    }
    this->MaxNames = iVar5;
    pNVar4 = (NameEntry *)
             M_Realloc_Dbg(this->NameArray,(long)iVar5 << 4,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/name.cpp"
                           ,0xdf);
    this->NameArray = pNVar4;
    iVar5 = this->NumNames;
  }
  pNVar4[iVar5].Text = __dest;
  pNVar4[iVar5].Hash = hash;
  pNVar4[iVar5].NextHash = this->Buckets[bucket];
  this->Buckets[bucket] = iVar5;
  this->NumNames = iVar5 + 1;
  return iVar5;
}

Assistant:

int FName::NameManager::AddName (const char *text, unsigned int hash, unsigned int bucket)
{
	char *textstore;
	NameBlock *block = Blocks;
	size_t len = strlen (text) + 1;

	// Get a block large enough for the name. Only the first block in the
	// list is ever considered for name storage.
	if (block == NULL || block->NextAlloc + len >= BLOCK_SIZE)
	{
		block = AddBlock (len);
	}

	// Copy the string into the block.
	textstore = (char *)block + block->NextAlloc;
	strcpy (textstore, text);
	block->NextAlloc += len;

	// Add an entry for the name to the NameArray
	if (NumNames >= MaxNames)
	{
		// If no names have been defined yet, make the first allocation
		// large enough to hold all the predefined names.
		MaxNames += MaxNames == 0 ? countof(PredefinedNames) + NAME_GROW_AMOUNT : NAME_GROW_AMOUNT;

		NameArray = (NameEntry *)M_Realloc (NameArray, MaxNames * sizeof(NameEntry));
	}

	NameArray[NumNames].Text = textstore;
	NameArray[NumNames].Hash = hash;
	NameArray[NumNames].NextHash = Buckets[bucket];
	Buckets[bucket] = NumNames;

	return NumNames++;
}